

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::InitializeUpdateData<unsigned_long>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,SelectionVector *sel)

{
  bool bVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  idx_t iVar4;
  sel_t *psVar5;
  unsigned_long uVar6;
  UnifiedVectorFormat *in_RCX;
  long in_RDX;
  undefined8 *in_RDI;
  SelectionVector *in_R8;
  sel_t base_idx;
  idx_t i_1;
  sel_t *base_tuples;
  unsigned_long *base_tuple_data;
  ValidityMask *base_validity;
  unsigned_long *base_array_data;
  idx_t idx;
  idx_t i;
  unsigned_long *tuple_data;
  unsigned_long *update_data;
  SelectionVector *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  sel_t sVar7;
  ulong local_70;
  ulong local_40;
  
  puVar2 = UnifiedVectorFormat::GetData<unsigned_long>(in_RCX);
  puVar3 = UpdateInfo::GetData<unsigned_long>((UpdateInfo *)0xbc35ac);
  for (local_40 = 0; local_40 < *(uint *)(in_RDX + 0x20); local_40 = local_40 + 1) {
    in_stack_ffffffffffffff80 = in_RCX->sel;
    iVar4 = SelectionVector::get_index(in_R8,local_40);
    iVar4 = SelectionVector::get_index(in_stack_ffffffffffffff80,iVar4);
    puVar3[local_40] = puVar2[iVar4];
  }
  puVar2 = FlatVector::GetData<unsigned_long>((Vector *)0xbc3630);
  FlatVector::Validity((Vector *)0xbc363f);
  puVar3 = UpdateInfo::GetData<unsigned_long>((UpdateInfo *)0xbc3651);
  psVar5 = UpdateInfo::GetTuples((UpdateInfo *)0xbc3663);
  for (local_70 = 0; local_70 < *(uint *)(in_RDI + 4); local_70 = local_70 + 1) {
    sVar7 = psVar5[local_70];
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)
                       CONCAT44(sVar7,in_stack_ffffffffffffff88),(idx_t)in_stack_ffffffffffffff80);
    if (bVar1) {
      uVar6 = UpdateSelectElement::Operation<unsigned_long>((UpdateSegment *)*in_RDI,puVar2[sVar7]);
      puVar3[local_70] = uVar6;
    }
  }
  return;
}

Assistant:

static void InitializeUpdateData(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                                 UnifiedVectorFormat &update, const SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto tuple_data = update_info.GetData<T>();

	for (idx_t i = 0; i < update_info.N; i++) {
		auto idx = update.sel->get_index(sel.get_index(i));
		tuple_data[i] = update_data[idx];
	}

	auto base_array_data = FlatVector::GetData<T>(base_data);
	auto &base_validity = FlatVector::Validity(base_data);
	auto base_tuple_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	for (idx_t i = 0; i < base_info.N; i++) {
		auto base_idx = base_tuples[i];
		if (!base_validity.RowIsValid(base_idx)) {
			continue;
		}
		base_tuple_data[i] = UpdateSelectElement::Operation<T>(*base_info.segment, base_array_data[base_idx]);
	}
}